

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YamlParser.h
# Opt level: O2

ExpectedRef<const_Mapping,_std::string> * __thiscall
yaml::Value::getMapping_abi_cxx11_
          (ExpectedRef<const_Mapping,_std::string> *__return_storage_ptr__,Value *this)

{
  allocator<char> local_59;
  undefined1 *local_58;
  undefined8 local_50;
  undefined1 local_48 [8];
  undefined8 uStack_40;
  undefined1 *local_38;
  undefined8 local_30;
  undefined1 local_28 [8];
  undefined8 uStack_20;
  
  if (this->type_ == Mapping) {
    (__return_storage_ptr__->field_0).value_._M_data = &this->mapping_;
    __return_storage_ptr__->has_value_ = true;
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_58,"Value is not of Mapping type",&local_59);
    local_38 = local_28;
    if (local_58 == local_48) {
      uStack_20 = uStack_40;
    }
    else {
      local_38 = local_58;
    }
    local_30 = local_50;
    local_50 = 0;
    local_48[0] = 0;
    local_58 = local_48;
    Expected<std::reference_wrapper<const_yaml::Mapping>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::Expected(__return_storage_ptr__,(UnexpectedType *)&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    std::__cxx11::string::~string((string *)&local_58);
  }
  return __return_storage_ptr__;
}

Assistant:

ExpectedRef<const Mapping, std::string> getMapping() const {
		if (type_ != Type::Mapping)
			return Unexpected<std::string>("Value is not of Mapping type");
		return std::cref(mapping_);
	}